

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conn.cpp
# Opt level: O1

int __thiscall Conn::do_send(Conn *this,ConnInfo *conn_info)

{
  _Base_ptr p_Var1;
  uint uVar2;
  ssize_t sVar3;
  uint *puVar4;
  char *pcVar5;
  const_iterator __pos;
  size_t __n;
  _Base_ptr p_Var6;
  int *piVar7;
  _Rb_tree<int,std::pair<int_const,ConnInfo>,std::_Select1st<std::pair<int_const,ConnInfo>>,std::less<int>,std::allocator<std::pair<int_const,ConnInfo>>>
  *this_00;
  uint uVar8;
  tuple<> tStack_39;
  _Head_base<0UL,_const_int_&,_false> _Stack_38;
  code *pcStack_30;
  uint local_28;
  
  __n = (long)(conn_info->buf)._r_pos - (long)(conn_info->buf)._w_pos;
  if (__n == 0) {
    uVar8 = 0;
  }
  else {
    pcStack_30 = (code *)0x103240;
    sVar3 = write(conn_info->fd,(conn_info->buf)._w_pos,__n);
    uVar8 = (uint)sVar3;
  }
  if ((int)uVar8 < 0) {
    pcStack_30 = (code *)0x103252;
    puVar4 = (uint *)__errno_location();
    uVar8 = *puVar4;
    if (uVar8 != 0xb) {
      pcStack_30 = Epoll::get;
      do_send();
      uVar2 = *(uint *)&(conn_info->ip)._M_dataplus._M_p;
      pcStack_30 = (code *)(ulong)uVar2;
      if ((int)uVar2 < (int)uVar8) {
        this_00 = (_Rb_tree<int,std::pair<int_const,ConnInfo>,std::_Select1st<std::pair<int_const,ConnInfo>>,std::less<int>,std::allocator<std::pair<int_const,ConnInfo>>>
                   *)(ulong)uVar8;
        piVar7 = (int *)(ulong)uVar2;
        _Stack_38._M_head_impl = (int *)0x10331f;
        Epoll::get();
        p_Var6 = *(_Base_ptr *)(this_00 + 0x10);
        p_Var1 = (_Base_ptr)(this_00 + 8);
        __pos._M_node = p_Var1;
        if (p_Var6 != (_Base_ptr)0x0) {
          do {
            if (*piVar7 <= (int)p_Var6[1]._M_color) {
              __pos._M_node = p_Var6;
            }
            p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < *piVar7];
          } while (p_Var6 != (_Base_ptr)0x0);
        }
        if ((__pos._M_node == p_Var1) || (*piVar7 < (int)__pos._M_node[1]._M_color)) {
          _Stack_38._M_head_impl = piVar7;
          __pos._M_node =
               (_Base_ptr)
               std::
               _Rb_tree<int,std::pair<int_const,ConnInfo>,std::_Select1st<std::pair<int_const,ConnInfo>>,std::less<int>,std::allocator<std::pair<int_const,ConnInfo>>>
               ::
               _M_emplace_hint_unique<std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<>>
                         (this_00,__pos,(piecewise_construct_t *)&std::piecewise_construct,
                          (tuple<const_int_&> *)&_Stack_38,&tStack_39);
        }
        return (int)__pos._M_node + 0x28;
      }
      return uVar8 * 0xc + (int)(conn_info->ip)._M_string_length;
    }
  }
  else {
    pcStack_30 = (code *)0x10329b;
    local_28 = uVar8;
    fprintf(_stderr,"%s(%d)-<%s>: send fd: %d done, total nbytes: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
            ,0xaf,"do_send",(ulong)(uint)conn_info->fd);
    pcStack_30 = (code *)0x1032a3;
    fflush(_stderr);
    pcVar5 = (conn_info->buf)._w_pos + uVar8;
    (conn_info->buf)._w_pos = pcVar5;
    if ((conn_info->buf)._r_pos == pcVar5) {
      (conn_info->buf)._r_pos = (conn_info->buf)._buf;
      (conn_info->buf)._w_pos = (conn_info->buf)._buf;
    }
    if ((conn_info->readeof == true) && ((conn_info->buf)._r_pos == (conn_info->buf)._w_pos)) {
      return -4;
    }
  }
  return 0;
}

Assistant:

int Conn::do_send(ConnInfo *conn_info)
{
    Buff &buf = conn_info->buf;
    int nsend = 0;

    if (buf.data_size() > 0)
    {
        nsend = write(conn_info->fd, buf._w_pos, buf.data_size());
    }
    
    if (nsend < 0)
    {
        if (errno != EAGAIN)
        {
            LOG_PRINT("send fd: %d occurs error, error: %s", conn_info->fd, strerror(errno));
            exit(err_svr_send_error);
        }
    }
    else
    {
        LOG_PRINT("send fd: %d done, total nbytes: %d", conn_info->fd, nsend);
        buf.set_w_pos(nsend);
        if (conn_info->readeof && buf.data_size() == 0)
        {
            return err_svr_send_disconn;
        }
    }

    return err_svr_send_normal;
}